

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

CURLcode Curl_conn_connect(Curl_easy *data,int sockindex,_Bool blocking,_Bool *done)

{
  Curl_cfilter *cf_00;
  connectdata *pcVar1;
  _Bool _Var2;
  CURLcode CVar3;
  uint uVar4;
  int iVar5;
  curltime cVar6;
  timediff_t local_e0;
  undefined1 local_bc [4];
  int rc;
  easy_pollset ps;
  curl_socket_t sockfd;
  timediff_t timeout_ms;
  undefined4 uStack_84;
  CURLcode local_7c;
  CURLcode result;
  Curl_cfilter *cf;
  curl_pollfds cpfds;
  pollfd a_few_on_stack [5];
  _Bool *done_local;
  _Bool blocking_local;
  int sockindex_local;
  Curl_easy *data_local;
  
  local_7c = CURLE_OK;
  cf_00 = data->conn->cfilter[sockindex];
  if (cf_00 == (Curl_cfilter *)0x0) {
    *done = false;
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    *done = (cf_00->field_0x24 & 1) != 0;
    if ((*done & 1U) == 0) {
      Curl_pollfds_init((curl_pollfds *)&cf,(pollfd *)&cpfds.field_0x10,5);
      do {
        if (((*done ^ 0xffU) & 1) == 0) goto LAB_0011ff1e;
        _Var2 = Curl_conn_needs_flush(data,sockindex);
        if (((_Var2) && (CVar3 = Curl_conn_flush(data,sockindex), CVar3 != CURLE_OK)) &&
           (CVar3 != CURLE_AGAIN)) {
          return CVar3;
        }
        local_7c = (*(code *)cf_00->cft->do_connect)(cf_00,data,done);
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && ((cf_00 != (Curl_cfilter *)0x0 && (0 < cf_00->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf_00,"Curl_conn_connect(block=%d) -> %d, done=%d",(ulong)blocking,
                            (ulong)local_7c,(ulong)(*done & 1));
        }
        if ((local_7c == CURLE_OK) && ((*done & 1U) != 0)) {
          cf_cntrl_update_info(data,data->conn);
          conn_report_connect_stats(data,data->conn);
          pcVar1 = data->conn;
          cVar6 = Curl_now();
          (pcVar1->keepalive).tv_sec = cVar6.tv_sec;
          *(ulong *)&(pcVar1->keepalive).tv_usec = CONCAT44(uStack_84,cVar6.tv_usec);
          Curl_verboseconnect(data,data->conn,sockindex);
          goto LAB_0011ff1e;
        }
        if (local_7c != CURLE_OK) {
          if ((((data != (Curl_easy *)0x0) &&
               ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
              (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) && ((cf_00 != (Curl_cfilter *)0x0 && (0 < cf_00->cft->log_level)))) {
            Curl_trc_cf_infof(data,cf_00,"Curl_conn_connect(), filter returned %d",(ulong)local_7c);
          }
          conn_report_connect_stats(data,data->conn);
          goto LAB_0011ff1e;
        }
        if (!blocking) goto LAB_0011ff1e;
        register0x00000000 = Curl_timeleft(data,(curltime *)0x0,true);
        ps.actions._0_4_ = Curl_conn_cf_get_socket(cf_00,data);
        if (stack0xffffffffffffff68 < 0) {
          Curl_failf(data,"connect timeout");
          local_7c = CURLE_OPERATION_TIMEDOUT;
          goto LAB_0011ff1e;
        }
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && ((cf_00 != (Curl_cfilter *)0x0 && (0 < cf_00->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf_00,"Curl_conn_connect(block=1), do poll");
        }
        Curl_pollfds_reset((curl_pollfds *)&cf);
        memset(local_bc,0,0x20);
        if (ps.actions._0_4_ != -1) {
          Curl_pollset_change(data,(easy_pollset *)local_bc,ps.actions._0_4_,2,1);
        }
        Curl_conn_adjust_pollset(data,data->conn,(easy_pollset *)local_bc);
        local_7c = Curl_pollfds_add_ps((curl_pollfds *)&cf,(easy_pollset *)local_bc);
        if (local_7c != CURLE_OK) goto LAB_0011ff1e;
        iVar5 = 10;
        if ((uint)cpfds.pfds != 0) {
          iVar5 = 1000;
        }
        if (stack0xffffffffffffff68 < iVar5) {
          local_e0 = stack0xffffffffffffff68;
        }
        else {
          iVar5 = 10;
          if ((uint)cpfds.pfds != 0) {
            iVar5 = 1000;
          }
          local_e0 = (timediff_t)iVar5;
        }
        uVar4 = Curl_poll((pollfd *)cf,(uint)cpfds.pfds,local_e0);
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && ((cf_00 != (Curl_cfilter *)0x0 && (0 < cf_00->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf_00,"Curl_conn_connect(block=1), Curl_poll() -> %d",(ulong)uVar4)
          ;
        }
      } while (-1 < (int)uVar4);
      local_7c = CURLE_COULDNT_CONNECT;
LAB_0011ff1e:
      Curl_pollfds_cleanup((curl_pollfds *)&cf);
      data_local._4_4_ = local_7c;
    }
    else {
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_conn_connect(struct Curl_easy *data,
                           int sockindex,
                           bool blocking,
                           bool *done)
{
#define CF_CONN_NUM_POLLS_ON_STACK 5
  struct pollfd a_few_on_stack[CF_CONN_NUM_POLLS_ON_STACK];
  struct curl_pollfds cpfds;
  struct Curl_cfilter *cf;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);

  cf = data->conn->cfilter[sockindex];
  if(!cf) {
    *done = FALSE;
    return CURLE_FAILED_INIT;
  }

  *done = cf->connected;
  if(*done)
    return CURLE_OK;

  Curl_pollfds_init(&cpfds, a_few_on_stack, CF_CONN_NUM_POLLS_ON_STACK);
  while(!*done) {
    if(Curl_conn_needs_flush(data, sockindex)) {
      DEBUGF(infof(data, "Curl_conn_connect(index=%d), flush", sockindex));
      result = Curl_conn_flush(data, sockindex);
      if(result && (result != CURLE_AGAIN))
        return result;
    }

    result = cf->cft->do_connect(cf, data, done);
    CURL_TRC_CF(data, cf, "Curl_conn_connect(block=%d) -> %d, done=%d",
                blocking, result, *done);
    if(!result && *done) {
      /* Now that the complete filter chain is connected, let all filters
       * persist information at the connection. E.g. cf-socket sets the
       * socket and ip related information. */
      cf_cntrl_update_info(data, data->conn);
      conn_report_connect_stats(data, data->conn);
      data->conn->keepalive = Curl_now();
      Curl_verboseconnect(data, data->conn, sockindex);
      goto out;
    }
    else if(result) {
      CURL_TRC_CF(data, cf, "Curl_conn_connect(), filter returned %d",
                  result);
      conn_report_connect_stats(data, data->conn);
      goto out;
    }

    if(!blocking)
      goto out;
    else {
      /* check allowed time left */
      const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);
      curl_socket_t sockfd = Curl_conn_cf_get_socket(cf, data);
      struct easy_pollset ps;
      int rc;

      if(timeout_ms < 0) {
        /* no need to continue if time already is up */
        failf(data, "connect timeout");
        result = CURLE_OPERATION_TIMEDOUT;
        goto out;
      }

      CURL_TRC_CF(data, cf, "Curl_conn_connect(block=1), do poll");
      Curl_pollfds_reset(&cpfds);
      memset(&ps, 0, sizeof(ps));
      /* In general, we want to send after connect, wait on that. */
      if(sockfd != CURL_SOCKET_BAD)
        Curl_pollset_set_out_only(data, &ps, sockfd);
      Curl_conn_adjust_pollset(data, data->conn, &ps);
      result = Curl_pollfds_add_ps(&cpfds, &ps);
      if(result)
        goto out;

      rc = Curl_poll(cpfds.pfds, cpfds.n,
                     CURLMIN(timeout_ms, (cpfds.n ? 1000 : 10)));
      CURL_TRC_CF(data, cf, "Curl_conn_connect(block=1), Curl_poll() -> %d",
                  rc);
      if(rc < 0) {
        result = CURLE_COULDNT_CONNECT;
        goto out;
      }
      /* continue iterating */
    }
  }

out:
  Curl_pollfds_cleanup(&cpfds);
  return result;
}